

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int planxythetamlevlat(PlannerType plannerType,char *envCfgFilename,char *motPrimFilename,
                      bool forwardSearch)

{
  FILE *__stream;
  byte bVar1;
  _Ios_Openmode _Var2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  ARAPlanner *this;
  ADPlanner *this_00;
  anaPlanner *this_01;
  ostream *poVar6;
  size_type sVar7;
  reference pvVar8;
  byte in_CL;
  vector *in_RSI;
  undefined4 in_EDI;
  uint i;
  vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> xythetaPath;
  FILE *fSol;
  char *sol;
  SBPLPlanner *planner;
  vector<int,_std::allocator<int>_> solution_stateIDs_V;
  stringstream ss_1;
  int addlevind;
  stringstream ss;
  uchar cost_possibly_circumscribed_thresh_addlevels [2];
  uchar cost_inscribed_thresh_addlevels [2];
  int numofaddlevels;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> perimeterptsVV [2];
  EnvironmentNAVXYTHETAMLEVLAT environment_navxythetalat;
  double halflength;
  double halfwidth;
  sbpl_2Dpt_t pt_m;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> perimeterptsV;
  bool bforwardsearch;
  bool bsearchuntilfirstsolution;
  MDPConfig MDPCfg;
  double initialEpsilon;
  double allocated_time_secs;
  int bRet;
  string *in_stack_fffffffffffff7c8;
  vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *in_stack_fffffffffffff7d0;
  value_type *in_stack_fffffffffffff7d8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff7e0;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *local_810;
  undefined4 uVar9;
  allocator<char> *in_stack_fffffffffffff800;
  char *in_stack_fffffffffffff808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff810;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *local_6e8;
  uint local_6d4;
  vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> local_6d0;
  FILE *local_6b8;
  char *local_6b0;
  undefined4 local_6a4;
  ARAPlanner *local_6a0;
  vector<int,_std::allocator<int>_> local_698;
  undefined1 local_679;
  allocator<char> local_651;
  string local_650 [32];
  stringstream local_630 [16];
  ostream local_620 [376];
  int local_4a8;
  undefined1 local_4a1;
  allocator<char> local_479;
  string local_478 [32];
  stringstream local_458 [16];
  ostream local_448 [376];
  undefined1 local_2d0;
  undefined1 local_2cf;
  uchar local_2ce [2];
  uint local_2cc;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> local_2c8 [2];
  _IO_FILE local_298 [2];
  double local_88;
  double local_80;
  sbpl_2Dpt_t local_68;
  char local_58 [30];
  byte local_3a;
  byte local_39;
  undefined4 local_38;
  undefined4 local_34;
  undefined8 local_30;
  undefined8 local_28;
  int local_20;
  byte local_19;
  vector *local_10;
  undefined4 local_8;
  int local_4;
  
  local_3a = in_CL & 1;
  local_20 = 0;
  local_28 = 0x4024000000000000;
  local_30 = 0x4008000000000000;
  local_39 = 0;
  local_19 = local_3a;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::vector
            ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)0x10de5d);
  sbpl_2Dpt_t::sbpl_2Dpt_t(&local_68);
  local_80 = 0.02;
  local_88 = 0.02;
  local_68.x = -0.02;
  local_68.y = -0.02;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back
            ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)in_stack_fffffffffffff7e0,
             in_stack_fffffffffffff7d8);
  local_68.x = local_88;
  local_68.y = -local_80;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back
            ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)in_stack_fffffffffffff7e0,
             in_stack_fffffffffffff7d8);
  local_68.x = local_88;
  local_68.y = local_80;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back
            ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)in_stack_fffffffffffff7e0,
             in_stack_fffffffffffff7d8);
  local_68.x = -local_88;
  local_68.y = local_80;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back
            ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)in_stack_fffffffffffff7e0,
             in_stack_fffffffffffff7d8);
  EnvironmentNAVXYTHETAMLEVLAT::EnvironmentNAVXYTHETAMLEVLAT
            ((EnvironmentNAVXYTHETAMLEVLAT *)(local_2c8 + 2));
  bVar1 = EnvironmentNAVXYTHETALATTICE::InitializeEnv((char *)(local_2c8 + 2),local_10,local_58);
  if ((bVar1 & 1) == 0) {
    uVar4 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8);
    __cxa_throw(uVar4,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  local_6e8 = local_2c8;
  do {
    std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::vector
              ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)0x10e0b8);
    local_6e8 = local_6e8 + 1;
  } while (local_6e8 != local_2c8 + 2);
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::clear
            ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)0x10e0ee);
  local_80 = 0.02;
  local_88 = 0.02;
  local_68.x = -0.02;
  local_68.y = -0.02;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back
            ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)in_stack_fffffffffffff7e0,
             in_stack_fffffffffffff7d8);
  local_68.x = local_88;
  local_68.y = -local_80;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back
            ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)in_stack_fffffffffffff7e0,
             in_stack_fffffffffffff7d8);
  local_68.x = local_88;
  local_68.y = local_80;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back
            ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)in_stack_fffffffffffff7e0,
             in_stack_fffffffffffff7d8);
  local_68.x = -local_88;
  local_68.y = local_80;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back
            ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)in_stack_fffffffffffff7e0,
             in_stack_fffffffffffff7d8);
  local_2cc = 1;
  printf("Number of additional levels = %d\n",1);
  local_2ce[0] = 0xff;
  local_2d0 = 0;
  local_2ce[1] = 0xff;
  local_2cf = 0;
  bVar1 = EnvironmentNAVXYTHETAMLEVLAT::InitializeAdditionalLevels
                    ((int)local_2c8 + 0x30,(vector *)(ulong)local_2cc,(uchar *)local_2c8,local_2ce);
  if ((bVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff810,in_stack_fffffffffffff808,in_stack_fffffffffffff800);
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_458,local_478,_Var2);
    std::__cxx11::string::~string(local_478);
    std::allocator<char>::~allocator(&local_479);
    std::ostream::operator<<(local_448,local_2cc);
    local_4a1 = 1;
    uVar4 = __cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
    local_4a1 = 0;
    __cxa_throw(uVar4,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  local_4a8 = 0;
  lVar5 = EnvironmentNAVXYTHETALATTICE::GetEnvNavConfig();
  bVar1 = EnvironmentNAVXYTHETAMLEVLAT::Set2DMapforAddLev
                    ((uchar **)(local_2c8 + 2),(int)*(undefined8 *)(lVar5 + 0x28));
  if ((bVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff810,in_stack_fffffffffffff808,in_stack_fffffffffffff800);
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_630,local_650,_Var2);
    std::__cxx11::string::~string(local_650);
    std::allocator<char>::~allocator(&local_651);
    std::ostream::operator<<(local_620,local_4a8);
    local_679 = 1;
    uVar4 = __cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
    local_679 = 0;
    __cxa_throw(uVar4,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  bVar1 = EnvironmentNAVXYTHETALATTICE::InitializeMDPCfg((MDPConfig *)(local_2c8 + 2));
  if ((bVar1 & 1) == 0) {
    uVar4 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8);
    __cxa_throw(uVar4,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10e753);
  local_6a0 = (ARAPlanner *)0x0;
  switch(local_8) {
  case 0:
    printf("Initializing ADPlanner...\n");
    this_00 = (ADPlanner *)operator_new(0x98);
    ADPlanner::ADPlanner(this_00,(DiscreteSpaceInformation *)(local_2c8 + 2),(bool)(local_3a & 1));
    local_6a0 = (ARAPlanner *)this_00;
    break;
  case 1:
    printf("Initializing ARAPlanner...\n");
    this = (ARAPlanner *)operator_new(0xa0);
    ARAPlanner::ARAPlanner(this,(DiscreteSpaceInformation *)(local_2c8 + 2),(bool)(local_3a & 1));
    local_6a0 = this;
    break;
  default:
    printf("Invalid planner type\n");
    break;
  case 3:
    printf("Invalid configuration: xytheta environment does not support rstar planner...\n");
    local_4 = 0;
    local_6a4 = 1;
    goto LAB_0010ee9c;
  case 5:
    printf("Initializing anaPlanner...\n");
    this_01 = (anaPlanner *)operator_new(0x48);
    anaPlanner::anaPlanner(this_01,(DiscreteSpaceInformation *)(local_2c8 + 2),(bool)(local_3a & 1))
    ;
    local_6a0 = (ARAPlanner *)this_01;
  }
  iVar3 = (**(code **)(*(long *)local_6a0 + 0x28))(local_6a0,local_38);
  if (iVar3 == 0) {
    printf("ERROR: failed to set start state\n");
    uVar4 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8);
    __cxa_throw(uVar4,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  iVar3 = (**(code **)(*(long *)local_6a0 + 0x20))(local_6a0,local_34);
  if (iVar3 == 0) {
    printf("ERROR: failed to set goal state\n");
    uVar4 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8);
    __cxa_throw(uVar4,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  (**(code **)(*(long *)local_6a0 + 0x90))(local_30);
  (**(code **)(*(long *)local_6a0 + 0x40))(local_6a0,local_39 & 1);
  printf("start planning...\n");
  local_20 = (*(code *)**(undefined8 **)local_6a0)(local_28,local_6a0,&local_698);
  printf("done planning\n");
  poVar6 = std::operator<<((ostream *)&std::cout,"size of solution=");
  sVar7 = std::vector<int,_std::allocator<int>_>::size(&local_698);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar7);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  EnvironmentNAVXYTHETALATTICE::PrintTimeStat((_IO_FILE *)(local_2c8 + 2));
  local_6b0 = "sol.txt";
  local_6b8 = fopen("sol.txt","w");
  if (local_6b8 == (FILE *)0x0) {
    printf("ERROR: could not open solution file\n");
    uVar4 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8);
    __cxa_throw(uVar4,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::vector
            ((vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)0x10ec9c);
  EnvironmentNAVXYTHETALAT::ConvertStateIDPathintoXYThetaPath
            ((vector *)(local_2c8 + 2),(vector *)&local_698);
  sVar7 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::size(&local_6d0);
  printf("solution size=%d\n",sVar7 & 0xffffffff);
  for (local_6d4 = 0;
      sVar7 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::size(&local_6d0)
      , __stream = local_6b8, local_6d4 < sVar7; local_6d4 = local_6d4 + 1) {
    pvVar8 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::at
                       (in_stack_fffffffffffff7d0,(size_type)in_stack_fffffffffffff7c8);
    uVar4 = *(undefined8 *)pvVar8;
    pvVar8 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::at
                       (in_stack_fffffffffffff7d0,(size_type)in_stack_fffffffffffff7c8);
    uVar9 = (undefined4)*(undefined8 *)(pvVar8 + 8);
    pvVar8 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::at
                       (in_stack_fffffffffffff7d0,(size_type)in_stack_fffffffffffff7c8);
    fprintf(__stream,"%.3f %.3f %.3f\n",uVar4,uVar9,*(undefined8 *)(pvVar8 + 0x10));
  }
  fclose(local_6b8);
  EnvironmentNAVXYTHETALATTICE::PrintTimeStat((_IO_FILE *)(local_2c8 + 2));
  if (local_20 == 0) {
    printf("Solution does not exist\n");
  }
  else {
    printf("Solution is found\n");
  }
  fflush((FILE *)0x0);
  if (local_6a0 != (ARAPlanner *)0x0) {
    (**(code **)(*(long *)local_6a0 + 0xa0))();
  }
  local_4 = local_20;
  local_6a4 = 1;
  std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::~vector
            ((vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)
             in_stack_fffffffffffff7e0);
LAB_0010ee9c:
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffff7e0);
  local_810 = local_2c8 + 2;
  do {
    local_810 = local_810 + -1;
    std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::~vector(local_810);
  } while (local_810 != local_2c8);
  EnvironmentNAVXYTHETAMLEVLAT::~EnvironmentNAVXYTHETAMLEVLAT
            ((EnvironmentNAVXYTHETAMLEVLAT *)(local_2c8 + 2));
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::~vector(local_810);
  return local_4;
}

Assistant:

int planxythetamlevlat(PlannerType plannerType, char* envCfgFilename, char* motPrimFilename, bool forwardSearch)
{
    int bRet = 0;

    double allocated_time_secs = 10.0; //in seconds
    double initialEpsilon = 3.0;
    MDPConfig MDPCfg;
    bool bsearchuntilfirstsolution = false;
    bool bforwardsearch = forwardSearch;

    //set the perimeter of the robot (it is given with 0,0,0 robot ref. point for which planning is done)
    //this is for the default level - base level
    vector<sbpl_2Dpt_t> perimeterptsV;
    sbpl_2Dpt_t pt_m;
    double halfwidth = 0.02; //0.3;
    double halflength = 0.02; //0.45;
    pt_m.x = -halflength;
    pt_m.y = -halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = -halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = -halflength;
    pt_m.y = halfwidth;
    perimeterptsV.push_back(pt_m);

    //Initialize Environment (should be called before initializing anything else)
    EnvironmentNAVXYTHETAMLEVLAT environment_navxythetalat;

    if (!environment_navxythetalat.InitializeEnv(envCfgFilename, perimeterptsV, motPrimFilename)) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }

    //this is for the second level - upper body level
    vector<sbpl_2Dpt_t> perimeterptsVV[2];
    perimeterptsVV[0].clear();
    halfwidth = 0.02;
    halflength = 0.02;
    pt_m.x = -halflength;
    pt_m.y = -halfwidth;
    perimeterptsVV[0].push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = -halfwidth;
    perimeterptsVV[0].push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = halfwidth;
    perimeterptsVV[0].push_back(pt_m);
    pt_m.x = -halflength;
    pt_m.y = halfwidth;
    perimeterptsVV[0].push_back(pt_m);

    //	perimeterptsV.clear();
    //	perimeterptsVV[0].clear();

    //enable the second level
    int numofaddlevels = 1;
    printf("Number of additional levels = %d\n", numofaddlevels);
    unsigned char cost_inscribed_thresh_addlevels[2]; //size should be at least numofaddlevels
    unsigned char cost_possibly_circumscribed_thresh_addlevels[2]; //size should be at least numofaddlevels
    //no costs are indicative of whether a cell is within inner circle
    cost_inscribed_thresh_addlevels[0] = 255;
    //no costs are indicative of whether a cell is within outer circle
    cost_possibly_circumscribed_thresh_addlevels[0] = 0;
    //no costs are indicative of whether a cell is within inner circle
    cost_inscribed_thresh_addlevels[1] = 255;
    //no costs are indicative of whether a cell is within outer circle
    cost_possibly_circumscribed_thresh_addlevels[1] = 0;
    if (!environment_navxythetalat.InitializeAdditionalLevels(numofaddlevels, perimeterptsVV,
                                                              cost_inscribed_thresh_addlevels,
                                                              cost_possibly_circumscribed_thresh_addlevels))
    {
        std::stringstream ss("ERROR: InitializeAdditionalLevels failed with numofaddlevels=");
        ss << numofaddlevels;
        throw SBPL_Exception(ss.str());
    }

    //set the map for the second level (index parameter for the additional levels and is zero based)
    //for this example, we pass in the same map as the map for the base. In general, it can be a totally different map
    //as it corresponds to a different level
    //NOTE: this map has to have costs set correctly with respect to inner and outer radii of the robot
    //if the second level of the robot has these radii different than at the base level, then costs
    //should reflect this
    //(see explanation for cost_possibly_circumscribed_thresh and
    //cost_inscribed_thresh parameters in environment_navxythetalat.h file)
    int addlevind = 0;
    if (!environment_navxythetalat.Set2DMapforAddLev(
            (const unsigned char**)(environment_navxythetalat.GetEnvNavConfig()->Grid2D), addlevind))
    {
        std::stringstream ss("ERROR: Setting Map for the Additional Level failed with level ");
        ss << addlevind;
        throw SBPL_Exception(ss.str());
    }

    // Initialize MDP Info
    if (!environment_navxythetalat.InitializeMDPCfg(&MDPCfg)) {
        throw SBPL_Exception("ERROR: InitializeMDPCfg failed");
    }

    // plan a path
    vector<int> solution_stateIDs_V;

    SBPLPlanner* planner = NULL;
    switch (plannerType) {
    case PLANNER_TYPE_ARASTAR:
        printf("Initializing ARAPlanner...\n");
        planner = new ARAPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    case PLANNER_TYPE_ADSTAR:
        printf("Initializing ADPlanner...\n");
        planner = new ADPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    case PLANNER_TYPE_RSTAR:
        printf("Invalid configuration: xytheta environment does not support rstar planner...\n");
        return 0;
    case PLANNER_TYPE_ANASTAR:
        printf("Initializing anaPlanner...\n");
        planner = new anaPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    default:
        printf("Invalid planner type\n");
        break;
    }

    if (planner->set_start(MDPCfg.startstateid) == 0) {
        printf("ERROR: failed to set start state\n");
        throw SBPL_Exception("ERROR: failed to set start state");
    }

    if (planner->set_goal(MDPCfg.goalstateid) == 0) {
        printf("ERROR: failed to set goal state\n");
        throw SBPL_Exception("ERROR: failed to set goal state");
    }
    planner->set_initialsolution_eps(initialEpsilon);

    //set search mode
    planner->set_search_mode(bsearchuntilfirstsolution);

    printf("start planning...\n");
    bRet = planner->replan(allocated_time_secs, &solution_stateIDs_V);
    printf("done planning\n");
    std::cout << "size of solution=" << solution_stateIDs_V.size() << std::endl;

    environment_navxythetalat.PrintTimeStat(stdout);

    const char* sol = "sol.txt";
    FILE* fSol = fopen(sol, "w");
    if (fSol == NULL) {
        printf("ERROR: could not open solution file\n");
        throw SBPL_Exception("ERROR: could not open solution file");
    }
    vector<sbpl_xy_theta_pt_t> xythetaPath;
    environment_navxythetalat.ConvertStateIDPathintoXYThetaPath(&solution_stateIDs_V, &xythetaPath);
    printf("solution size=%d\n", (unsigned int)xythetaPath.size());
    for (unsigned int i = 0; i < xythetaPath.size(); i++) {
        fprintf(fSol, "%.3f %.3f %.3f\n", xythetaPath.at(i).x, xythetaPath.at(i).y, xythetaPath.at(i).theta);
    }
    fclose(fSol);

    environment_navxythetalat.PrintTimeStat(stdout);

    //print a path
    if (bRet) {
        //print the solution
        printf("Solution is found\n");
    }
    else {
        printf("Solution does not exist\n");
    }

    fflush(NULL);

    delete planner;

    return bRet;
}